

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O2

void __thiscall glu::InterfaceBlock::InterfaceBlock(InterfaceBlock *this)

{
  (this->layout).location = -1;
  (this->layout).binding = -1;
  (this->layout).offset = -1;
  (this->layout).format = FORMATLAYOUT_LAST;
  *(undefined8 *)&(this->layout).matrixOrder = 0x700000002;
  this->memoryAccessQualifierFlags = 0;
  (this->interfaceName)._M_dataplus._M_p = (pointer)&(this->interfaceName).field_2;
  (this->interfaceName)._M_string_length = 0;
  (this->interfaceName).field_2._M_local_buf[0] = '\0';
  (this->instanceName)._M_dataplus._M_p = (pointer)&(this->instanceName).field_2;
  (this->instanceName)._M_string_length = 0;
  (this->instanceName).field_2._M_local_buf[0] = '\0';
  (this->variables).
  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->variables).
  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->variables).
  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dimensions).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->dimensions).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->dimensions).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Layout::Layout (int location_, int binding_, int offset_, FormatLayout format_, MatrixOrder matrixOrder_)
	: location			(location_)
	, binding			(binding_)
	, offset			(offset_)
	, format			(format_)
	, matrixOrder		(matrixOrder_)
{
}